

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O3

void jinit_c_prep_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  _func_void_j_compress_ptr_J_BUF_MODE *__dest;
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_c_prep_controller *pjVar3;
  void *pvVar4;
  JSAMPARRAY ppJVar5;
  ulong uVar6;
  jpeg_component_info *pjVar7;
  void *pvVar8;
  JDIMENSION *pJVar9;
  long lVar10;
  long lVar11;
  
  if (need_full_buffer != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 4;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  pjVar3 = (jpeg_c_prep_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x70);
  cinfo->prep = pjVar3;
  pjVar3->start_pass = start_pass_prep;
  if (cinfo->downsample->need_context_rows == 0) {
    pjVar3->pre_process_data = pre_process_data;
    if (0 < cinfo->num_components) {
      pJVar9 = &cinfo->comp_info->width_in_blocks;
      lVar10 = 0;
      do {
        ppJVar5 = (*cinfo->mem->alloc_sarray)
                            ((j_common_ptr)cinfo,1,
                             (JDIMENSION)
                             ((long)((long)cinfo->max_h_samp_factor * (ulong)*pJVar9 * 8) /
                             (long)(int)pJVar9[-5]),cinfo->max_v_samp_factor);
        (&pjVar3[1].start_pass)[lVar10] = (_func_void_j_compress_ptr_J_BUF_MODE *)ppJVar5;
        lVar10 = lVar10 + 1;
        pJVar9 = pJVar9 + 0x18;
      } while (lVar10 < cinfo->num_components);
    }
  }
  else {
    pjVar3->pre_process_data = pre_process_context;
    uVar1 = cinfo->max_v_samp_factor;
    pvVar4 = (*cinfo->mem->alloc_small)
                       ((j_common_ptr)cinfo,1,(long)(int)(cinfo->num_components * uVar1 * 5) << 3);
    if (0 < cinfo->num_components) {
      pjVar7 = cinfo->comp_info;
      pvVar8 = (void *)((long)pvVar4 + (ulong)(uVar1 * 4) * 8);
      lVar11 = (long)(int)(uVar1 * 5) * 8;
      lVar10 = 0;
      do {
        ppJVar5 = (*cinfo->mem->alloc_sarray)
                            ((j_common_ptr)cinfo,1,
                             (JDIMENSION)
                             ((long)((long)cinfo->max_h_samp_factor * (ulong)pjVar7->width_in_blocks
                                    * 8) / (long)pjVar7->h_samp_factor),uVar1 * 3);
        __dest = (_func_void_j_compress_ptr_J_BUF_MODE *)((long)pvVar4 + (long)(int)uVar1 * 8);
        memcpy(__dest,ppJVar5,(long)(int)uVar1 * 0x18);
        if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            *(JSAMPROW *)((long)pvVar4 + uVar6 * 8) = ppJVar5[uVar1 * 2 + uVar6];
            *(JSAMPROW *)((long)pvVar8 + uVar6 * 8) = ppJVar5[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        (&pjVar3[1].start_pass)[lVar10] = __dest;
        pvVar4 = (void *)((long)pvVar4 + lVar11);
        lVar10 = lVar10 + 1;
        pjVar7 = pjVar7 + 1;
        pvVar8 = (void *)((long)pvVar8 + lVar11);
      } while (lVar10 < cinfo->num_components);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_prep_controller(j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_prep_ptr prep;
  int ci;
  jpeg_component_info *compptr;

  if (need_full_buffer)         /* safety check */
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  prep = (my_prep_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_prep_controller));
  cinfo->prep = (struct jpeg_c_prep_controller *)prep;
  prep->pub.start_pass = start_pass_prep;

  /* Allocate the color conversion buffer.
   * We make the buffer wide enough to allow the downsampler to edge-expand
   * horizontally within the buffer, if it so chooses.
   */
  if (cinfo->downsample->need_context_rows) {
    /* Set up to provide context rows */
#ifdef CONTEXT_ROWS_SUPPORTED
    prep->pub.pre_process_data = pre_process_context;
    create_context_buffer(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* No context, just make it tall enough for one row group */
    prep->pub.pre_process_data = pre_process_data;
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      prep->color_buf[ci] = (*cinfo->mem->alloc_sarray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE,
         (JDIMENSION)(((long)compptr->width_in_blocks * DCTSIZE *
                       cinfo->max_h_samp_factor) / compptr->h_samp_factor),
         (JDIMENSION)cinfo->max_v_samp_factor);
    }
  }
}